

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceSpanTask::convert_bio_to_bilou(multi_ex *ec)

{
  uint uVar1;
  size_type sVar2;
  reference ppeVar3;
  polylabel *ppVar4;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  action nexty;
  action y;
  label_t *ylab;
  size_t n;
  uint local_34;
  ulong local_10;
  
  for (local_10 = 0; sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI),
      local_10 < sVar2; local_10 = local_10 + 1) {
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDI,local_10);
    ppVar4 = &(*ppeVar3)->l;
    uVar1 = (ppVar4->multi).label;
    sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI);
    if (local_10 == sVar2 - 1) {
      local_34 = 0;
    }
    else {
      ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDI,local_10 + 1);
      local_34 = ((*ppeVar3)->l).multi.label;
    }
    if (uVar1 != 1) {
      if ((uVar1 & 1) == 0) {
        if (local_34 == uVar1 + 1) {
          (ppVar4->multi).label = ((uVar1 >> 1) - 1) * 4 + 3;
        }
        else {
          (ppVar4->multi).label = ((uVar1 >> 1) - 1) * 4 + 2;
        }
      }
      else if ((uVar1 & 1) == 1) {
        if (local_34 == uVar1) {
          (ppVar4->multi).label = (uVar1 - 1) * 2;
        }
        else {
          (ppVar4->multi).label = (uVar1 - 1) * 2 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void convert_bio_to_bilou(multi_ex& ec)
{
  for (size_t n = 0; n < ec.size(); n++)
  {
    MULTICLASS::label_t& ylab = ec[n]->l.multi;
    action y = ylab.label;
    action nexty = (n == ec.size() - 1) ? 0 : ec[n + 1]->l.multi.label;
    if (y == 1)  // do nothing
      ;
    else if (y % 2 == 0)  // this is a begin-X
    {
      if (nexty != y + 1)                  // should be unit
        ylab.label = (y / 2 - 1) * 4 + 2;  // from 2 to 2, 4 to 6, 6 to 10, etc.
      else                                 // should be begin-X
        ylab.label = (y / 2 - 1) * 4 + 3;  // from 2 to 3, 4 to 7, 6 to 11, etc.
    }
    else if (y % 2 == 1)  // this is an in-X
    {
      if (nexty != y)                  // should be last
        ylab.label = (y - 1) * 2 + 1;  // from 3 to 5, 5 to 9, 7 to 13, etc.
      else                             // should be in-X
        ylab.label = (y - 1) * 2;      // from 3 to 4, 5 to 8, 7 to 12, etc.
    }
    assert(y == bilou_to_bio(ylab.label));
  }
}